

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O2

PDFObject * __thiscall PDFObjectParser::ParseDictionary(PDFObjectParser *this)

{
  bool bVar1;
  __type _Var2;
  bool bVar3;
  EStatusCode EVar4;
  PDFDictionary *this_00;
  PDFObject *inOriginal;
  string *psVar5;
  Trace *pTVar6;
  int iVar7;
  byte bVar8;
  undefined8 local_b0 [4];
  PDFObjectCastPtr<PDFName> aKey;
  RefCountPtr<PDFObject> aValue;
  string token;
  string local_50;
  
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  EVar4 = IncreaseAndCheckDepth(this);
  if (EVar4 == eSuccess) {
    this_00 = (PDFDictionary *)operator_new(0x78);
    PDFDictionary::PDFDictionary(this_00);
    iVar7 = 0;
    do {
      bVar1 = GetNextToken(this,&token);
      bVar8 = 0;
      if (!bVar1 || iVar7 != 0) goto LAB_001a2566;
      _Var2 = std::operator==(&scDoubleRightAngle_abi_cxx11_,&token);
      if (_Var2) {
        bVar8 = 1;
        iVar7 = 0;
        goto LAB_001a2566;
      }
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front(&this->mTokenBuffer,&token);
      inOriginal = ParseNewObject(this);
      aKey.super_RefCountPtr<PDFName>.mValue = PDFObjectCast<PDFName>(inOriginal);
      aKey.super_RefCountPtr<PDFName>._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d998;
      if (aKey.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0) {
        pTVar6 = Trace::DefaultTrace();
        std::__cxx11::string::substr((ulong)local_b0,(ulong)&token);
        Trace::TraceToLog(pTVar6,
                          "PDFObjectParser::ParseDictionary, failure to parse key for a dictionary. token = %s"
                          ,local_b0[0]);
        std::__cxx11::string::~string((string *)local_b0);
        bVar1 = false;
        iVar7 = -1;
      }
      else {
        aValue.mValue = ParseNewObject(this);
        aValue._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
        bVar1 = aValue.mValue != (PDFObject *)0x0;
        if (aValue.mValue == (PDFObject *)0x0) {
          pTVar6 = Trace::DefaultTrace();
          std::__cxx11::string::substr((ulong)local_b0,(ulong)&token);
          Trace::TraceToLog(pTVar6,
                            "PDFObjectParser::ParseDictionary, failure to parse value for a dictionary. token = %s"
                            ,local_b0[0]);
          std::__cxx11::string::~string((string *)local_b0);
          iVar7 = -1;
        }
        else {
          psVar5 = PDFName::GetValue_abi_cxx11_(aKey.super_RefCountPtr<PDFName>.mValue);
          std::__cxx11::string::string((string *)&local_50,(string *)psVar5);
          bVar3 = PDFDictionary::Exists(this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          iVar7 = 0;
          if (!bVar3) {
            PDFDictionary::Insert(this_00,aKey.super_RefCountPtr<PDFName>.mValue,aValue.mValue);
          }
        }
        RefCountPtr<PDFObject>::~RefCountPtr(&aValue);
      }
      RefCountPtr<PDFName>::~RefCountPtr(&aKey.super_RefCountPtr<PDFName>);
    } while (bVar1);
    bVar8 = 0;
LAB_001a2566:
    EVar4 = DecreaseAndCheckDepth(this);
    if ((bool)(bVar8 & (EVar4 == eSuccess && iVar7 == 0))) goto LAB_001a25c8;
    (*(this_00->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])();
    pTVar6 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)local_b0,(ulong)&token);
    Trace::TraceToLog(pTVar6,
                      "PDFObjectParser::ParseDictionary, failure to parse dictionary, didn\'t find end of array or failure to parse dictionary member object. token = %s"
                      ,local_b0[0]);
    std::__cxx11::string::~string((string *)local_b0);
  }
  this_00 = (PDFDictionary *)0x0;
LAB_001a25c8:
  std::__cxx11::string::~string((string *)&token);
  return &this_00->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseDictionary()
{
	PDFDictionary* aDictionary;
	bool dictionaryEndEncountered = false;
	std::string token;
	EStatusCode status = PDFHummus::eSuccess;

	if(IncreaseAndCheckDepth() != eSuccess)
		return NULL;

	aDictionary = new PDFDictionary();

	while(GetNextToken(token) && PDFHummus::eSuccess == status)
	{
		dictionaryEndEncountered = (scDoubleRightAngle == token);
		if(dictionaryEndEncountered)
			break;

		ReturnTokenToBuffer(token);

		// Parse Key
		PDFObjectCastPtr<PDFName> aKey(ParseNewObject());
		if(!aKey)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse key for a dictionary. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}


		// Parse Value
		RefCountPtr<PDFObject> aValue = ParseNewObject();
		if(!aValue)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse value for a dictionary. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}
	

		// all good. i'm gonna be forgiving here and allow skipping duplicate keys. cause it happens
		if(!aDictionary->Exists(aKey->GetValue()))
			aDictionary->Insert(aKey.GetPtr(),aValue.GetPtr());
	}

	if(DecreaseAndCheckDepth() != eSuccess)
		status = eFailure;
		
	if(dictionaryEndEncountered && PDFHummus::eSuccess == status)
	{
		return aDictionary;
	}
	else
	{
		delete aDictionary;
		TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse dictionary, didn't find end of array or failure to parse dictionary member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}
}